

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

void freeregs(FuncState *fs,int r1,int r2)

{
  int reg;
  
  reg = r2;
  if (r2 < r1) {
    reg = r1;
  }
  if (r2 <= r1) {
    r1 = r2;
  }
  freereg(fs,reg);
  freereg(fs,r1);
  return;
}

Assistant:

static void freeregs (FuncState *fs, int r1, int r2) {
  if (r1 > r2) {
    freereg(fs, r1);
    freereg(fs, r2);
  }
  else {
    freereg(fs, r2);
    freereg(fs, r1);
  }
}